

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# handle_user_cmd.cxx
# Opt level: O2

void __thiscall nuraft::raft_server::cleanup_auto_fwd_pkgs(raft_server *this)

{
  element_type *peVar1;
  __buckets_ptr pp_Var2;
  element_type *peVar3;
  int iVar4;
  long lVar5;
  __node_base *p_Var6;
  __node_base *p_Var7;
  element_type *peVar8;
  mutex *__mutex;
  ptr<auto_fwd_pkg> pkg;
  string local_50;
  
  std::mutex::lock(&this->rpc_clients_lock_);
  p_Var6 = &(this->auto_fwd_pkgs_)._M_h._M_before_begin;
  while (p_Var6 = p_Var6->_M_nxt, p_Var6 != (__node_base *)0x0) {
    std::__shared_ptr<nuraft::raft_server::auto_fwd_pkg,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              (&pkg.
                super___shared_ptr<nuraft::raft_server::auto_fwd_pkg,_(__gnu_cxx::_Lock_policy)2>,
               (__shared_ptr<nuraft::raft_server::auto_fwd_pkg,_(__gnu_cxx::_Lock_policy)2> *)
               (p_Var6 + 2));
    EventAwaiter::invoke
              (&(pkg.
                 super___shared_ptr<nuraft::raft_server::auto_fwd_pkg,_(__gnu_cxx::_Lock_policy)2>.
                _M_ptr)->ea_);
    __mutex = &(pkg.
                super___shared_ptr<nuraft::raft_server::auto_fwd_pkg,_(__gnu_cxx::_Lock_policy)2>.
               _M_ptr)->lock_;
    std::mutex::lock(__mutex);
    peVar1 = (this->l_).super___shared_ptr<nuraft::logger,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    if ((peVar1 != (element_type *)0x0) &&
       (iVar4 = (**(code **)(*(long *)peVar1 + 0x38))(), 3 < iVar4)) {
      peVar1 = (this->l_).super___shared_ptr<nuraft::logger,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      msg_if_given_abi_cxx11_
                (&local_50,"srv %d, in-use %zu, idle %zu",(ulong)(uint)*(size_type *)(p_Var6 + 1),
                 ((pkg.
                   super___shared_ptr<nuraft::raft_server::auto_fwd_pkg,_(__gnu_cxx::_Lock_policy)2>
                  ._M_ptr)->rpc_client_in_use_)._M_h._M_element_count,
                 ((pkg.
                   super___shared_ptr<nuraft::raft_server::auto_fwd_pkg,_(__gnu_cxx::_Lock_policy)2>
                  ._M_ptr)->rpc_client_idle_).
                 super__List_base<std::shared_ptr<nuraft::rpc_client>,_std::allocator<std::shared_ptr<nuraft::rpc_client>_>_>
                 ._M_impl._M_node._M_size);
      (**(code **)(*(long *)peVar1 + 0x40))
                (peVar1,4,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/src/handle_user_cmd.cxx"
                 ,"cleanup_auto_fwd_pkgs",0x16d,&local_50);
      std::__cxx11::string::~string((string *)&local_50);
    }
    p_Var7 = &((pkg.
                super___shared_ptr<nuraft::raft_server::auto_fwd_pkg,_(__gnu_cxx::_Lock_policy)2>.
               _M_ptr)->rpc_client_in_use_)._M_h._M_before_begin;
    while (peVar3 = pkg.
                    super___shared_ptr<nuraft::raft_server::auto_fwd_pkg,_(__gnu_cxx::_Lock_policy)2>
                    ._M_ptr, p_Var7 = p_Var7->_M_nxt,
          peVar8 = pkg.
                   super___shared_ptr<nuraft::raft_server::auto_fwd_pkg,_(__gnu_cxx::_Lock_policy)2>
                   ._M_ptr, p_Var7 != (__node_base *)0x0) {
      peVar1 = (this->l_).super___shared_ptr<nuraft::logger,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      if ((peVar1 != (element_type *)0x0) &&
         (iVar4 = (**(code **)(*(long *)peVar1 + 0x38))(), 5 < iVar4)) {
        peVar1 = (this->l_).super___shared_ptr<nuraft::logger,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
        if (*(_Hash_node_base **)&((_Prime_rehash_policy *)(p_Var7 + 2))->_M_max_load_factor ==
            (_Hash_node_base *)0x0) {
          lVar5 = 0;
        }
        else {
          lVar5 = (long)*(int *)&(*(_Hash_node_base **)
                                   &((_Prime_rehash_policy *)(p_Var7 + 2))->_M_max_load_factor)[1].
                                 _M_nxt;
        }
        msg_if_given_abi_cxx11_(&local_50,"use count %zu",lVar5);
        (**(code **)(*(long *)peVar1 + 0x40))
                  (peVar1,6,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/src/handle_user_cmd.cxx"
                   ,"cleanup_auto_fwd_pkgs",0x16f,&local_50);
        std::__cxx11::string::~string((string *)&local_50);
      }
    }
    while (peVar8 = (element_type *)
                    (peVar8->rpc_client_idle_).
                    super__List_base<std::shared_ptr<nuraft::rpc_client>,_std::allocator<std::shared_ptr<nuraft::rpc_client>_>_>
                    ._M_impl._M_node.super__List_node_base._M_next, peVar8 != peVar3) {
      peVar1 = (this->l_).super___shared_ptr<nuraft::logger,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      if ((peVar1 != (element_type *)0x0) &&
         (iVar4 = (**(code **)(*(long *)peVar1 + 0x38))(), 5 < iVar4)) {
        peVar1 = (this->l_).super___shared_ptr<nuraft::logger,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
        pp_Var2 = (peVar8->rpc_client_in_use_)._M_h._M_buckets;
        if (pp_Var2 == (__buckets_ptr)0x0) {
          lVar5 = 0;
        }
        else {
          lVar5 = (long)*(int *)(pp_Var2 + 1);
        }
        msg_if_given_abi_cxx11_(&local_50,"use count %zu",lVar5);
        (**(code **)(*(long *)peVar1 + 0x40))
                  (peVar1,6,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/src/handle_user_cmd.cxx"
                   ,"cleanup_auto_fwd_pkgs",0x172,&local_50);
        std::__cxx11::string::~string((string *)&local_50);
      }
    }
    std::__cxx11::
    list<std::shared_ptr<nuraft::rpc_client>,_std::allocator<std::shared_ptr<nuraft::rpc_client>_>_>
    ::clear(&(pkg.super___shared_ptr<nuraft::raft_server::auto_fwd_pkg,_(__gnu_cxx::_Lock_policy)2>.
             _M_ptr)->rpc_client_idle_);
    std::
    _Hashtable<std::shared_ptr<nuraft::rpc_client>,_std::shared_ptr<nuraft::rpc_client>,_std::allocator<std::shared_ptr<nuraft::rpc_client>_>,_std::__detail::_Identity,_std::equal_to<std::shared_ptr<nuraft::rpc_client>_>,_std::hash<std::shared_ptr<nuraft::rpc_client>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
    ::clear(&((pkg.super___shared_ptr<nuraft::raft_server::auto_fwd_pkg,_(__gnu_cxx::_Lock_policy)2>
              ._M_ptr)->rpc_client_in_use_)._M_h);
    pthread_mutex_unlock((pthread_mutex_t *)__mutex);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&pkg.
                super___shared_ptr<nuraft::raft_server::auto_fwd_pkg,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount);
  }
  std::
  _Hashtable<int,_std::pair<const_int,_std::shared_ptr<nuraft::raft_server::auto_fwd_pkg>_>,_std::allocator<std::pair<const_int,_std::shared_ptr<nuraft::raft_server::auto_fwd_pkg>_>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  ::clear(&(this->auto_fwd_pkgs_)._M_h);
  pthread_mutex_unlock((pthread_mutex_t *)&this->rpc_clients_lock_);
  return;
}

Assistant:

void raft_server::cleanup_auto_fwd_pkgs() {
    auto_lock(rpc_clients_lock_);
    for (auto& entry: auto_fwd_pkgs_) {
        ptr<auto_fwd_pkg> pkg = entry.second;
        pkg->ea_.invoke();
        auto_lock(pkg->lock_);
        p_in("srv %d, in-use %zu, idle %zu",
             entry.first,
             pkg->rpc_client_in_use_.size(),
             pkg->rpc_client_idle_.size());
        for (auto& ee: pkg->rpc_client_in_use_) {
            p_tr("use count %zu", ee.use_count());
        }
        for (auto& ee: pkg->rpc_client_idle_) {
            p_tr("use count %zu", ee.use_count());
        }
        pkg->rpc_client_idle_.clear();
        pkg->rpc_client_in_use_.clear();
    }
    auto_fwd_pkgs_.clear();
}